

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outer_join_marker.cpp
# Opt level: O2

void __thiscall
duckdb::OuterJoinMarker::Scan
          (OuterJoinMarker *this,OuterJoinGlobalScanState *gstate,OuterJoinLocalScanState *lstate,
          DataChunk *result)

{
  ulong __n;
  idx_t iVar1;
  sel_t *psVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  idx_t iVar4;
  bool bVar5;
  reference pvVar6;
  reference other;
  idx_t iVar7;
  idx_t result_count;
  idx_t count;
  size_type sVar8;
  idx_t i_1;
  size_type sVar9;
  
  do {
    bVar5 = ColumnDataCollection::Scan
                      (gstate->data,&gstate->global_scan,&lstate->local_scan,&lstate->scan_chunk);
    if (!bVar5) {
      return;
    }
    iVar1 = (lstate->scan_chunk).count;
    psVar2 = (lstate->match_sel).sel_vector;
    _Var3._M_head_impl =
         (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    iVar4 = (lstate->local_scan).current_row_index;
    count = 0;
    for (iVar7 = 0; iVar1 != iVar7; iVar7 = iVar7 + 1) {
      if (_Var3._M_head_impl[iVar7 + iVar4] == false) {
        psVar2[count] = (sel_t)iVar7;
        count = count + 1;
      }
    }
  } while (count == 0);
  sVar8 = ((long)(lstate->scan_chunk).data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(lstate->scan_chunk).data.
                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start) / -0x68 +
          ((long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x68;
  for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&result->data,sVar9);
    Vector::SetVectorType(pvVar6,CONSTANT_VECTOR);
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&result->data,sVar9);
    ConstantVector::SetNull(pvVar6,true);
  }
  for (sVar9 = 0; __n = sVar9 + sVar8,
      __n < (ulong)(((long)(result->data).
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(result->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x68); sVar9 = sVar9 + 1) {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&result->data,__n);
    other = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)lstate,sVar9);
    Vector::Slice(pvVar6,other,&lstate->match_sel,count);
  }
  result->count = count;
  return;
}

Assistant:

void OuterJoinMarker::Scan(OuterJoinGlobalScanState &gstate, OuterJoinLocalScanState &lstate, DataChunk &result) {
	D_ASSERT(gstate.data);
	// fill in NULL values for the LHS
	while (gstate.data->Scan(gstate.global_scan, lstate.local_scan, lstate.scan_chunk)) {
		idx_t result_count = 0;
		// figure out which tuples didn't find a match in the RHS
		for (idx_t i = 0; i < lstate.scan_chunk.size(); i++) {
			if (!found_match[lstate.local_scan.current_row_index + i]) {
				lstate.match_sel.set_index(result_count++, i);
			}
		}
		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			idx_t left_column_count = result.ColumnCount() - lstate.scan_chunk.ColumnCount();
			for (idx_t i = 0; i < left_column_count; i++) {
				result.data[i].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result.data[i], true);
			}
			for (idx_t col_idx = left_column_count; col_idx < result.ColumnCount(); col_idx++) {
				result.data[col_idx].Slice(lstate.scan_chunk.data[col_idx - left_column_count], lstate.match_sel,
				                           result_count);
			}
			result.SetCardinality(result_count);
			return;
		}
	}
}